

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O3

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  size_type in_RCX;
  char *unaff_RBX;
  string_view sVar1;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  size_type unaff_retaddr;
  
  sVar1.size_ = unaff_retaddr;
  sVar1.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(sVar1);
  sv.data_ = (char *)sVar1.size_;
  sv.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv);
  filename.size_ = unaff_retaddr;
  filename.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename);
  sv_00.data_ = (char *)sVar1.size_;
  sv_00.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_00);
  filename_00.size_ = unaff_retaddr;
  filename_00.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_00);
  sv_01.data_ = (char *)sVar1.size_;
  sv_01.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_01);
  filename_01.size_ = unaff_retaddr;
  filename_01.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_01);
  sv_02.data_ = (char *)sVar1.size_;
  sv_02.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_02);
  filename_02.size_ = unaff_retaddr;
  filename_02.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_02);
  sv_03.data_ = (char *)sVar1.size_;
  sv_03.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_03);
  filename_03.size_ = unaff_retaddr;
  filename_03.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_03);
  sv_04.data_ = (char *)sVar1.size_;
  sv_04.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_04);
  filename_04.size_ = unaff_retaddr;
  filename_04.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_04);
  sv_05.data_ = (char *)sVar1.size_;
  sv_05.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x271ec2,sVar1.data_,sv_05);
  filename_05.size_ = unaff_retaddr;
  filename_05.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_05);
  sv_06.data_ = (char *)sVar1.size_;
  sv_06.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x27ebb3,sVar1.data_,sv_06);
  filename_06.size_ = unaff_retaddr;
  filename_06.data_ = unaff_RBX;
  sVar1 = wabt::GetBasename(filename_06);
  sv_07.data_ = (char *)sVar1.size_;
  sv_07.size_ = in_RCX;
  anon_unknown.dwarf_10b7e1::assert_string_view_eq
            ((anon_unknown_dwarf_10b7e1 *)0x274251,sVar1.data_,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}